

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

lys_submodule * yin_read_submodule(lys_module *module,char *data,unres_schema *unres)

{
  ly_ctx *ctx_00;
  int iVar1;
  lyxml_elem *elem;
  char *pcVar2;
  size_t len;
  LY_ERR *pLVar3;
  char *value;
  lys_submodule *submodule;
  lyxml_elem *yin;
  ly_ctx *ctx;
  unres_schema *unres_local;
  char *data_local;
  lys_module *module_local;
  
  ctx_00 = module->ctx;
  value = (char *)0x0;
  ctx = (ly_ctx *)unres;
  unres_local = (unres_schema *)data;
  data_local = (char *)module;
  elem = lyxml_parse_mem(ctx_00,data,2);
  if (elem != (lyxml_elem *)0x0) {
    if ((elem->name == (char *)0x0) || (iVar1 = strcmp(elem->name,"submodule"), iVar1 != 0)) {
      ly_vlog(ctx_00,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,elem->name);
    }
    else {
      pcVar2 = lyxml_get_attr(elem,"name",(char *)0x0);
      if (pcVar2 == (char *)0x0) {
        ly_vlog(ctx_00,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"name",elem->name);
      }
      else {
        iVar1 = lyp_check_identifier(ctx_00,pcVar2,LY_IDENT_NAME,(lys_module *)0x0,(lys_node *)0x0);
        if (iVar1 == 0) {
          value = (char *)calloc(1,0xb0);
          if ((lys_module *)value == (lys_module *)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_read_submodule");
          }
          else {
            ((lys_module *)value)->ctx = ctx_00;
            len = strlen(pcVar2);
            pcVar2 = lydict_insert(ctx_00,pcVar2,len);
            ((lys_module *)value)->name = pcVar2;
            ((lys_module *)value)->field_0x40 = ((lys_module *)value)->field_0x40 & 0xfe | 1;
            ((lys_module *)value)->field_0x40 =
                 ((lys_module *)value)->field_0x40 & 0x7f |
                 (char)(*(ushort *)(data_local + 0x40) >> 7) << 7;
            ((lys_module *)value)->data = (lys_node *)data_local;
            iVar1 = lyp_check_circmod_add((lys_module *)value);
            if (iVar1 == 0) {
              ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Reading submodule \"%s\".",
                     ((lys_module *)value)->name);
              iVar1 = read_sub_module((lys_module *)data_local,(lys_submodule *)value,elem,
                                      (unres_schema *)ctx);
              if (iVar1 == 0) {
                lyp_sort_revisions((lys_module *)value);
                lyxml_free(ctx_00,elem);
                lyp_check_circmod_pop(ctx_00);
                ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Submodule \"%s\" successfully parsed.",
                       ((lys_module *)value)->name);
                return (lys_submodule *)(lys_module *)value;
              }
            }
          }
        }
      }
    }
    lyxml_free(ctx_00,elem);
    if (value == (char *)0x0) {
      pLVar3 = ly_errno_glob_address();
      ly_log(ctx_00,LY_LLERR,*pLVar3,"Submodule parsing failed.");
    }
    else {
      pLVar3 = ly_errno_glob_address();
      ly_log(ctx_00,LY_LLERR,*pLVar3,"Submodule \"%s\" parsing failed.",*(undefined8 *)(value + 8));
      unres_schema_free((lys_module *)value,(unres_schema **)&ctx,0);
      lyp_check_circmod_pop(ctx_00);
      lys_sub_module_remove_devs_augs((lys_module *)value);
      lys_submodule_module_data_free((lys_submodule *)value);
      lys_submodule_free((lys_submodule *)value,(_func_void_lys_node_ptr_void_ptr *)0x0);
    }
  }
  return (lys_submodule *)0x0;
}

Assistant:

struct lys_submodule *
yin_read_submodule(struct lys_module *module, const char *data, struct unres_schema *unres)
{
    struct ly_ctx *ctx = module->ctx;
    struct lyxml_elem *yin;
    struct lys_submodule *submodule = NULL;
    const char *value;

    yin = lyxml_parse_mem(ctx, data, LYXML_PARSE_NOMIXEDCONTENT);
    if (!yin) {
        return NULL;
    }

    /* check root element */
    if (!yin->name || strcmp(yin->name, "submodule")) {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, yin->name);
        goto error;
    }

    GETVAL(ctx, value, yin, "name");
    if (lyp_check_identifier(ctx, value, LY_IDENT_NAME, NULL, NULL)) {
        goto error;
    }

    submodule = calloc(1, sizeof *submodule);
    LY_CHECK_ERR_GOTO(!submodule, LOGMEM(ctx), error);

    submodule->ctx = ctx;
    submodule->name = lydict_insert(ctx, value, strlen(value));
    submodule->type = 1;
    submodule->implemented = module->implemented;
    submodule->belongsto = module;

    /* add into the list of processed modules */
    if (lyp_check_circmod_add((struct lys_module *)submodule)) {
        goto error;
    }

    LOGVRB("Reading submodule \"%s\".", submodule->name);
    /* module cannot be changed in this case and 1 cannot be returned */
    if (read_sub_module(module, submodule, yin, unres)) {
        goto error;
    }

    lyp_sort_revisions((struct lys_module *)submodule);

    /* cleanup */
    lyxml_free(ctx, yin);
    lyp_check_circmod_pop(ctx);

    LOGVRB("Submodule \"%s\" successfully parsed.", submodule->name);
    return submodule;

error:
    /* cleanup */
    lyxml_free(ctx, yin);
    if (!submodule) {
        LOGERR(ctx, ly_errno, "Submodule parsing failed.");
        return NULL;
    }

    LOGERR(ctx, ly_errno, "Submodule \"%s\" parsing failed.", submodule->name);

    unres_schema_free((struct lys_module *)submodule, &unres, 0);
    lyp_check_circmod_pop(ctx);
    lys_sub_module_remove_devs_augs((struct lys_module *)submodule);
    lys_submodule_module_data_free(submodule);
    lys_submodule_free(submodule, NULL);
    return NULL;
}